

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O0

void __thiscall MallocBlock::Initialize(MallocBlock *this,size_t size,int type)

{
  AllocMap *this_00;
  bool bVar1;
  int32_t iVar2;
  SizeMap *this_01;
  ThreadCache *pTVar3;
  void *pvVar4;
  size_t *psVar5;
  ThreadCachePtr TVar6;
  void *p;
  size_t sStack_d8;
  int type_local;
  size_t size_local;
  MallocBlock *this_local;
  size_t allocated_size;
  ThreadCache *pTStack_b8;
  uint32_t cl;
  undefined1 local_b0;
  undefined1 local_a8 [8];
  ThreadCachePtr cache_ptr;
  AddressMap<int> *local_90;
  uint local_84;
  long lStack_80;
  uint32_t idx;
  bool local_78;
  undefined7 uStack_77;
  SizeMap *local_70;
  undefined1 local_61;
  uint *local_60;
  bool local_58;
  undefined7 uStack_57;
  char local_49;
  AddressMap<int> *local_48;
  AddressMap<int> *local_40;
  void *rv;
  FreeList *list;
  uint local_24;
  MallocBlock *local_20;
  ThreadCache *local_18;
  AddressMap<int> *local_10;
  
  sStack_d8 = size;
  size_local = (size_t)this;
  bVar1 = IsValidMagicValue(this,this->magic1_);
  if (!bVar1) {
    syscall(1,2,"Check failed: IsValidMagicValue(magic1_): \n",0x2b);
    abort();
  }
  SpinLock::Lock(&alloc_map_lock_);
  if (alloc_map_ == (AllocMap *)0x0) {
    cache_ptr.is_emergency_malloc_ = true;
    cache_ptr._9_7_ = 0;
    TVar6 = tcmalloc::ThreadCachePtr::Grab();
    pTStack_b8 = TVar6.ptr_;
    local_b0 = TVar6.is_emergency_malloc_;
    local_a8 = (undefined1  [8])pTStack_b8;
    cache_ptr.ptr_._0_1_ = local_b0;
    bVar1 = tcmalloc::ThreadCachePtr::IsEmergencyMallocEnabled((ThreadCachePtr *)local_a8);
    if (bVar1) {
      local_90 = (AddressMap<int> *)tcmalloc::EmergencyMalloc(cache_ptr._8_8_);
    }
    else {
      local_70 = tcmalloc::Static::sizemap();
      local_78 = cache_ptr.is_emergency_malloc_;
      uStack_77 = cache_ptr._9_7_;
      lStack_80 = (long)&allocated_size + 4;
      local_58 = cache_ptr.is_emergency_malloc_;
      uStack_57 = cache_ptr._9_7_;
      local_60 = &local_84;
      if ((ulong)cache_ptr._8_8_ < 0x401) {
        local_84 = cache_ptr._8_4_ + 7U >> 3;
        local_49 = '\x01';
      }
      else if ((ulong)cache_ptr._8_8_ < 0x40001) {
        local_84 = cache_ptr._8_4_ + 0x3c7fU >> 7;
        local_49 = '\x01';
      }
      else {
        local_49 = '\0';
      }
      local_61 = local_49 != '\0';
      if ((bool)local_61) {
        allocated_size._4_4_ = (uint)local_70->class_array_[local_84];
        this_01 = tcmalloc::Static::sizemap();
        iVar2 = tcmalloc::SizeMap::class_to_size(this_01,allocated_size._4_4_);
        this_local = (MallocBlock *)(long)iVar2;
        pTVar3 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_a8);
        bVar1 = tcmalloc::ThreadCache::SampleAllocation(pTVar3,(size_t)this_local);
        if (bVar1) {
          local_90 = (AddressMap<int> *)DoSampledAllocation(cache_ptr._8_8_);
        }
        else {
          pTVar3 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_a8);
          local_20 = this_local;
          local_24 = allocated_size._4_4_;
          list = (FreeList *)anon_unknown.dwarf_5601::nop_oom_handler;
          rv = pTVar3->list_ + allocated_size._4_4_;
          local_18 = pTVar3;
          iVar2 = tcmalloc::ThreadCache::FreeList::object_size((FreeList *)rv);
          local_20 = (MallocBlock *)(long)iVar2;
          bVar1 = tcmalloc::ThreadCache::FreeList::TryPop((FreeList *)rv,&local_40);
          if (bVar1) {
            pTVar3->size_ = pTVar3->size_ - (int32_t)local_20;
            local_10 = local_40;
          }
          else {
            local_10 = (AddressMap<int> *)
                       tcmalloc::ThreadCache::FetchFromCentralCache
                                 (pTVar3,local_24,(int32_t)local_20,(_func_void_ptr_size_t *)list);
          }
          local_48 = local_10;
          local_90 = local_10;
        }
      }
      else {
        pTVar3 = tcmalloc::ThreadCachePtr::get((ThreadCachePtr *)local_a8);
        local_90 = (AddressMap<int> *)
                   anon_unknown.dwarf_5601::do_malloc_pages(pTVar3,cache_ptr._8_8_);
      }
    }
    AddressMap<int>::AddressMap
              (local_90,anon_unknown.dwarf_5601::do_malloc,anon_unknown.dwarf_5601::do_free);
    alloc_map_ = local_90;
  }
  this_00 = alloc_map_;
  pvVar4 = data_addr(this);
  AddressMap<int>::Insert(this_00,pvVar4,type);
  this->size1_ = sStack_d8;
  this->offset_ = 0;
  this->alloc_type_ = (long)type;
  bVar1 = IsMMapped(this);
  if (!bVar1) {
    psVar5 = magic2_addr(this);
    bit_store<unsigned_long,unsigned_long>(psVar5,&this->magic1_);
    psVar5 = size2_addr(this);
    bit_store<unsigned_long,unsigned_long>(psVar5,&stack0xffffffffffffff28);
  }
  SpinLock::Unlock(&alloc_map_lock_);
  pvVar4 = data_addr(this);
  memset(pvVar4,0xab,sStack_d8);
  bVar1 = IsMMapped(this);
  if (!bVar1) {
    psVar5 = size2_addr(this);
    if (this->size1_ != *psVar5) {
      syscall(1,2,"Check failed: memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0: should hold\n",
              0x4e);
      abort();
    }
    psVar5 = magic2_addr(this);
    if (this->magic1_ != *psVar5) {
      syscall(1,2,
              "Check failed: memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0: should hold\n",
              0x51);
      abort();
    }
  }
  return;
}

Assistant:

void Initialize(size_t size, int type) {
    RAW_CHECK(IsValidMagicValue(magic1_), "");
    // record us as allocated in the map
    alloc_map_lock_.Lock();
    if (!alloc_map_) {
      void* p = do_malloc(sizeof(AllocMap));
      alloc_map_ = new(p) AllocMap(do_malloc, do_free);
    }
    alloc_map_->Insert(data_addr(), type);
    // initialize us
    size1_ = size;
    offset_ = 0;
    alloc_type_ = type;
    if (!IsMMapped()) {
      bit_store(magic2_addr(), &magic1_);
      bit_store(size2_addr(), &size);
    }
    alloc_map_lock_.Unlock();
    memset(data_addr(), kMagicUninitializedByte, size);
    if (!IsMMapped()) {
      RAW_CHECK(memcmp(&size1_, size2_addr(), sizeof(size1_)) == 0, "should hold");
      RAW_CHECK(memcmp(&magic1_, magic2_addr(), sizeof(magic1_)) == 0, "should hold");
    }
  }